

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O2

int main(int argc,char **argv)

{
  VkPhysicalDevice pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  GLenum GVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  VkResult VVar9;
  GLFWwindow *pGVar10;
  GLubyte *pGVar11;
  char **ppcVar12;
  byte *pbVar13;
  VkPhysicalDevice *__ptr;
  VkExtensionProperties *__ptr_00;
  VkLayerProperties *pVVar14;
  char *pcVar15;
  GLuint GVar16;
  VkExtensionProperties *pVVar17;
  char *pcVar18;
  byte *pbVar19;
  ulong uVar20;
  ulong uVar21;
  GLint auxbuffers;
  uint local_81c;
  VkLayerProperties *local_818;
  GLint accumalphabits;
  undefined4 uStack_80c;
  uint local_804;
  uint32_t pd_count;
  uint32_t re_count;
  GLint stencilbits;
  GLint depthbits;
  GLint alphabits;
  GLint bluebits;
  GLint greenbits;
  GLint redbits;
  undefined8 local_7e0;
  GLFWwindow *local_7d8;
  char *local_7d0;
  GLint accumbluebits;
  void *pvStack_7c0;
  char *local_7b8;
  undefined8 uStack_7b0;
  char *local_7a8;
  ulong uStack_7a0;
  int minor;
  undefined4 uStack_794;
  void *pvStack_790;
  undefined8 local_788;
  VkApplicationInfo *pVStack_780;
  undefined8 local_778;
  char **ppcStack_770;
  undefined8 local_768;
  char **ppcStack_760;
  int major;
  VkPhysicalDeviceType local_740;
  undefined1 local_73c [804];
  option options [31];
  
  memcpy(options,&PTR_anon_var_dwarf_35_0015b190,0x3e0);
  glfwGetVersion(&major,&minor,&accumbluebits);
  if (major == 3) {
    if ((minor != 3) || (accumbluebits != 4)) {
      puts("*** WARNING: GLFW version mismatch! ***");
    }
    glfwSetErrorCallback(error_callback);
    local_7e0 = 0;
    glfwInitHint(0x51002,0);
    iVar2 = glfwInit();
    if (iVar2 != 0) {
      iVar2 = 0;
switchD_00118c6e_caseD_6:
      iVar3 = iVar2;
      iVar4 = getopt_long(argc,argv,"a:b:c:dfhlm:n:p:s:v",options,(int *)0x0);
      pcVar15 = optarg;
      iVar2 = 1;
      switch(iVar4) {
      case 0:
        goto switchD_00118c6e_caseD_0;
      case 1:
        goto switchD_00118c6e_caseD_1;
      case 2:
        goto switchD_00118c6e_caseD_2;
      case 3:
        goto switchD_00118c6e_caseD_3;
      case 4:
        goto switchD_00118c6e_caseD_4;
      case 5:
        goto switchD_00118c6e_caseD_5;
      case 6:
        goto switchD_00118c6e_caseD_6;
      case 7:
        local_7e0 = 1;
        iVar2 = iVar3;
        goto switchD_00118c6e_caseD_6;
      case 8:
        goto switchD_00118c6e_caseD_8;
      case 9:
        goto switchD_00118c6e_caseD_9;
      case 10:
        goto switchD_00118c6e_caseD_a;
      case 0xb:
        goto switchD_00118c6e_caseD_b;
      case 0xc:
        goto switchD_00118c6e_caseD_c;
      case 0xd:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21001;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21001;
        }
        break;
      case 0xe:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21002;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21002;
        }
        break;
      case 0xf:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21003;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21003;
        }
        break;
      case 0x10:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21004;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21004;
        }
        break;
      case 0x11:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21005;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21005;
        }
        break;
      case 0x12:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21006;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21006;
        }
        break;
      case 0x13:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21007;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21007;
        }
        break;
      case 0x14:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21008;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21008;
        }
        break;
      case 0x15:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x21009;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x21009;
        }
        break;
      case 0x16:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x2100a;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x2100a;
        }
        break;
      case 0x17:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x2100b;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x2100b;
        }
        break;
      case 0x18:
        if ((*optarg == '-') && (optarg[1] == '\0')) {
          iVar2 = -1;
          iVar4 = 0x2100d;
        }
        else {
          iVar2 = atoi(optarg);
          iVar4 = 0x2100d;
        }
        break;
      case 0x19:
        iVar2 = 1;
        iVar4 = 0x2100c;
        break;
      case 0x1a:
        iVar2 = 1;
        iVar4 = 0x2100e;
        break;
      case 0x1b:
        iVar4 = 0x21010;
        iVar2 = 0;
        break;
      case 0x1c:
        iVar2 = 1;
        iVar4 = 0x2200a;
        break;
      case 0x1d:
        iVar2 = 1;
        iVar4 = 0x23003;
        break;
      case -1:
        goto switchD_00118c6e_caseD_ffffffff;
      default:
        goto code_r0x00118c89;
      }
      goto LAB_00119070;
    }
  }
  else {
    puts("*** ERROR: GLFW major version mismatch! ***");
  }
  goto LAB_00119180;
code_r0x00118c89:
  switch(iVar4) {
  case 0x61:
switchD_00118c6e_caseD_0:
    iVar2 = strcasecmp(optarg,"gl");
    if (iVar2 == 0) {
      iVar4 = 0x22001;
      iVar2 = 0x30001;
    }
    else {
      iVar2 = strcasecmp(pcVar15,"es");
      if (iVar2 != 0) goto switchD_00118c9a_caseD_65;
      iVar4 = 0x22001;
      iVar2 = 0x30002;
    }
    break;
  case 0x62:
switchD_00118c6e_caseD_2:
    iVar2 = strcasecmp(optarg,"none");
    if (iVar2 == 0) {
      iVar4 = 0x22009;
      iVar2 = 0x35002;
    }
    else {
      iVar2 = strcasecmp(pcVar15,"flush");
      if (iVar2 != 0) goto switchD_00118c9a_caseD_65;
      iVar4 = 0x22009;
      iVar2 = 0x35001;
    }
    break;
  case 99:
switchD_00118c6e_caseD_1:
    iVar2 = strcasecmp(optarg,"native");
    if (iVar2 == 0) {
      iVar4 = 0x2200b;
      iVar2 = 0x36001;
    }
    else {
      iVar2 = strcasecmp(pcVar15,"egl");
      if (iVar2 == 0) {
        iVar4 = 0x2200b;
        iVar2 = 0x36002;
      }
      else {
        iVar2 = strcasecmp(pcVar15,"osmesa");
        if (iVar2 != 0) goto switchD_00118c9a_caseD_65;
        iVar4 = 0x2200b;
        iVar2 = 0x36003;
      }
    }
    break;
  case 100:
switchD_00118c6e_caseD_3:
    iVar4 = 0x22007;
    goto LAB_00119070;
  default:
switchD_00118c9a_caseD_65:
    usage();
    goto LAB_00119180;
  case 0x66:
switchD_00118c6e_caseD_4:
    iVar4 = 0x22006;
    goto LAB_00119070;
  case 0x68:
switchD_00118c6e_caseD_5:
    usage();
    goto LAB_00119194;
  case 0x6c:
    goto switchD_00118c6e_caseD_6;
  case 0x6d:
switchD_00118c6e_caseD_8:
    iVar2 = atoi(optarg);
    iVar4 = 0x22002;
    goto LAB_00119070;
  case 0x6e:
switchD_00118c6e_caseD_9:
    iVar2 = atoi(optarg);
    iVar4 = 0x22003;
LAB_00119070:
    glfwWindowHint(iVar4,iVar2);
    iVar2 = iVar3;
    goto switchD_00118c6e_caseD_6;
  case 0x70:
switchD_00118c6e_caseD_a:
    iVar2 = strcasecmp(optarg,"core");
    if (iVar2 == 0) {
      iVar4 = 0x22008;
      iVar2 = 0x32001;
    }
    else {
      iVar2 = strcasecmp(pcVar15,"compat");
      if (iVar2 != 0) goto switchD_00118c9a_caseD_65;
      iVar4 = 0x22008;
      iVar2 = 0x32002;
    }
    break;
  case 0x73:
switchD_00118c6e_caseD_b:
    iVar2 = strcasecmp(optarg,"none");
    if (iVar2 == 0) {
      iVar4 = 0x22005;
      iVar2 = 0x31001;
    }
    else {
      iVar2 = strcasecmp(pcVar15,"lose");
      if (iVar2 != 0) goto switchD_00118c9a_caseD_65;
      iVar4 = 0x22005;
      iVar2 = 0x31002;
    }
    break;
  case 0x76:
switchD_00118c6e_caseD_c:
    print_version();
    goto LAB_00119194;
  }
  glfwWindowHint(iVar4,iVar2);
  iVar2 = iVar3;
  goto switchD_00118c6e_caseD_6;
switchD_00118c6e_caseD_ffffffff:
  print_version();
  glfwWindowHint(0x20004,0);
  pGVar10 = glfwCreateWindow(200,200,"Version",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (pGVar10 != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(pGVar10);
    gladLoadGL(glfwGetProcAddress);
    GVar5 = (*glad_glGetError)();
    if (GVar5 != 0) {
      printf("*** OpenGL error after make current: 0x%08x ***\n",(ulong)GVar5);
    }
    uVar6 = glfwGetWindowAttrib(pGVar10,0x22001);
    uVar7 = glfwGetWindowAttrib(pGVar10,0x22002);
    uVar8 = glfwGetWindowAttrib(pGVar10,0x22003);
    local_81c = glfwGetWindowAttrib(pGVar10,0x22004);
    local_7d8 = pGVar10;
    iVar2 = glfwGetWindowAttrib(pGVar10,0x22008);
    local_818 = (VkLayerProperties *)CONCAT44(local_818._4_4_,iVar2);
    pcVar15 = "Unknown API";
    if (uVar6 == 0x30002) {
      pcVar15 = "OpenGL ES";
    }
    pcVar18 = "OpenGL";
    if (uVar6 != 0x30001) {
      pcVar18 = pcVar15;
    }
    pGVar11 = (*glad_glGetString)(0x1f02);
    printf("%s context version string: \"%s\"\n",pcVar18,pGVar11);
    local_804 = uVar8;
    local_7d0 = pcVar18;
    printf("%s context version parsed by GLFW: %u.%u.%u\n",pcVar18,(ulong)uVar7,(ulong)uVar8,
           (ulong)local_81c);
    local_81c = uVar6;
    if (uVar6 == 0x30001) {
      if (2 < (int)uVar7) {
        (*glad_glGetIntegerv)(0x821e,&major);
        printf("%s context flags (0x%08x):","OpenGL",(ulong)(uint)major);
        if ((major & 1U) != 0) {
          printf(" forward-compatible");
        }
        if ((major & 2U) != 0) {
          printf(" debug");
        }
        pGVar10 = local_7d8;
        uVar6 = local_81c;
        if ((major & 4U) != 0) {
          printf(" robustness");
        }
        if ((major & 8U) != 0) {
          printf(" no-error");
        }
        putchar(10);
        printf("%s context flags parsed by GLFW:","OpenGL");
        iVar2 = glfwGetWindowAttrib(pGVar10,0x22006);
        if (iVar2 != 0) {
          printf(" forward-compatible");
        }
        iVar2 = glfwGetWindowAttrib(pGVar10,0x22007);
        if (iVar2 != 0) {
          printf(" debug");
        }
        iVar2 = glfwGetWindowAttrib(pGVar10,0x22005);
        if (iVar2 == 0x31002) {
          printf(" robustness");
        }
        iVar2 = glfwGetWindowAttrib(pGVar10,0x2200a);
        if (iVar2 != 0) {
          printf(" no-error");
        }
        putchar(10);
        if (1 < (int)local_804 || uVar7 != 3) {
          (*glad_glGetIntegerv)(0x9126,&major);
          pcVar18 = "unknown";
          pcVar15 = "core";
          if ((major & 1U) == 0) {
            pcVar15 = "unknown";
          }
          if ((major & 2U) != 0) {
            pcVar15 = "compat";
          }
          printf("%s profile mask (0x%08x): %s\n","OpenGL",(ulong)(uint)major,pcVar15);
          uVar6 = local_81c;
          if ((int)local_818 == 0x32001) {
            pcVar18 = "core";
          }
          if ((int)local_818 == 0x32002) {
            pcVar18 = "compat";
          }
          printf("%s profile mask parsed by GLFW: %s\n","OpenGL",pcVar18);
        }
      }
      if (GLAD_GL_ARB_robustness != 0) {
        iVar2 = glfwGetWindowAttrib(local_7d8,0x22005);
        (*glad_glGetIntegerv)(0x8256,&major);
        pcVar18 = "unknown";
        pcVar15 = "unknown";
        if (major == 0x8261) {
          pcVar15 = "none";
        }
        if (major == 0x8252) {
          pcVar15 = "lose";
        }
        printf("%s robustness strategy (0x%08x): %s\n","OpenGL",(ulong)(uint)major,pcVar15);
        uVar6 = local_81c;
        if (iVar2 == 0x31001) {
          pcVar18 = "none";
        }
        if (iVar2 == 0x31002) {
          pcVar18 = "lose";
        }
        printf("%s robustness strategy parsed by GLFW: %s\n","OpenGL",pcVar18);
      }
    }
    pGVar11 = (*glad_glGetString)(0x1f01);
    pcVar15 = local_7d0;
    printf("%s context renderer string: \"%s\"\n",local_7d0,pGVar11);
    pGVar11 = (*glad_glGetString)(0x1f00);
    printf("%s context vendor string: \"%s\"\n",pcVar15,pGVar11);
    if (1 < (int)uVar7) {
      pGVar11 = (*glad_glGetString)(0x8b8c);
      printf("%s context shading language version: \"%s\"\n",pcVar15,pGVar11);
    }
    printf("%s framebuffer:\n",pcVar15);
    if ((int)local_818 == 0x32001 && uVar6 == 0x30001) {
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8212,&redbits);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8213,&greenbits);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8214,&bluebits);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x402,0x8215,&alphabits);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x1801,0x8216,&depthbits);
      (*glad_glGetFramebufferAttachmentParameteriv)(0x8d40,0x1802,0x8217,&stencilbits);
    }
    else {
      (*glad_glGetIntegerv)(0xd52,&redbits);
      (*glad_glGetIntegerv)(0xd53,&greenbits);
      (*glad_glGetIntegerv)(0xd54,&bluebits);
      (*glad_glGetIntegerv)(0xd55,&alphabits);
      (*glad_glGetIntegerv)(0xd56,&depthbits);
      (*glad_glGetIntegerv)(0xd57,&stencilbits);
    }
    printf(" red: %u green: %u blue: %u alpha: %u depth: %u stencil: %u\n",(ulong)(uint)redbits,
           (ulong)(uint)greenbits,(ulong)(uint)bluebits,(ulong)(uint)alphabits,
           (ulong)(uint)depthbits,stencilbits);
    if ((2 < (int)local_804 || (uVar6 == 0x30002 || 1 < (int)uVar7)) || GLAD_GL_ARB_multisample != 0
       ) {
      (*glad_glGetIntegerv)(0x80a9,&major);
      (*glad_glGetIntegerv)(0x80a8,&minor);
      uVar6 = local_81c;
      printf(" samples: %u sample buffers: %u\n",(ulong)(uint)major,_minor & 0xffffffff);
    }
    if ((int)local_818 != 0x32001 && uVar6 == 0x30001) {
      (*glad_glGetIntegerv)(0xd58,&major);
      (*glad_glGetIntegerv)(0xd59,&minor);
      (*glad_glGetIntegerv)(0xd5a,&accumbluebits);
      (*glad_glGetIntegerv)(0xd5b,&accumalphabits);
      (*glad_glGetIntegerv)(0xc00,&auxbuffers);
      uVar6 = local_81c;
      printf(" accum red: %u accum green: %u accum blue: %u accum alpha: %u aux buffers: %u\n",
             (ulong)(uint)major,_minor & 0xffffffff,_accumbluebits & 0xffffffff,
             (ulong)(uint)accumalphabits,(ulong)(uint)auxbuffers);
    }
    if (iVar3 != 0) {
      printf("%s context extensions:\n",local_7d0);
      if ((int)uVar7 < 3 || uVar6 != 0x30001) {
        pbVar13 = (*glad_glGetString)(0x1f03);
        while (*pbVar13 != 0) {
          putchar(0x20);
          pbVar19 = pbVar13;
          pbVar13 = pbVar13 + -1;
          for (; (*pbVar19 & 0xdf) != 0; pbVar19 = pbVar19 + 1) {
            putchar((uint)*pbVar19);
            pbVar13 = pbVar13 + 1;
          }
          do {
            pbVar19 = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
          } while (*pbVar19 == 0x20);
          putchar(10);
        }
      }
      else {
        (*glad_glGetIntegerv)(0x821d,&major);
        for (GVar16 = 0; (int)GVar16 < major; GVar16 = GVar16 + 1) {
          pGVar11 = (*glad_glGetStringi)(0x1f03,GVar16);
          printf(" %s\n",pGVar11);
        }
      }
    }
    iVar2 = glfwVulkanSupported();
    pcVar15 = "available";
    if (iVar2 == 0) {
      pcVar15 = "missing";
    }
    printf("Vulkan loader: %s\n",pcVar15);
    iVar2 = glfwVulkanSupported();
    if (iVar2 == 0) {
LAB_0011988a:
      glfwTerminate();
LAB_00119194:
      exit(0);
    }
    local_7a8 = (char *)0x0;
    uStack_7a0._0_4_ = 0;
    uStack_7a0._4_4_ = 0;
    local_7b8 = (char *)0x0;
    uStack_7b0._0_4_ = 0;
    uStack_7b0._4_4_ = 0;
    _accumbluebits = 0;
    pvStack_7c0 = (void *)0x0;
    local_768._0_4_ = 0;
    local_768._4_4_ = 0;
    ppcStack_760 = (char **)0x0;
    local_778._0_4_ = 0;
    local_778._4_4_ = 0;
    ppcStack_770 = (char **)0x0;
    local_788._0_4_ = 0;
    local_788._4_4_ = 0;
    pVStack_780 = (VkApplicationInfo *)0x0;
    minor = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    uStack_794 = 0;
    pvStack_790 = (void *)0x0;
    gladLoadVulkanUserPtr((VkPhysicalDevice)0x0,glad_vulkan_callback,(void *)0x0);
    uVar6 = 0x400000;
    if (glad_vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) {
      VVar9 = (*glad_vkEnumerateInstanceVersion)((uint32_t *)&major);
      uVar6 = 0x400000;
      if (VVar9 == VK_SUCCESS) {
        uVar6 = major;
      }
    }
    printf("Vulkan loader API version: %i.%i\n",(ulong)(uVar6 >> 0x16),(ulong)(uVar6 >> 0xc & 0x3ff)
          );
    ppcVar12 = glfwGetRequiredInstanceExtensions(&re_count);
    printf("Vulkan required instance extensions:");
    if (ppcVar12 == (char **)0x0) {
      puts(" missing");
    }
    else {
      for (uVar20 = 0; uVar20 < re_count; uVar20 = uVar20 + 1) {
        printf(" %s");
      }
      putchar(10);
    }
    if (iVar3 != 0) {
      major = 0;
      puts("Vulkan instance extensions:");
      VVar9 = (*glad_vkEnumerateInstanceExtensionProperties)
                        ((char *)0x0,(uint32_t *)&major,(VkExtensionProperties *)0x0);
      if (VVar9 == VK_SUCCESS) {
        local_818 = (VkLayerProperties *)calloc((ulong)(uint)major,0x104);
        VVar9 = (*glad_vkEnumerateInstanceExtensionProperties)
                          ((char *)0x0,(uint32_t *)&major,(VkExtensionProperties *)local_818);
        if (VVar9 == VK_SUCCESS) {
          pVVar14 = local_818;
          for (uVar20 = 0; uVar20 < (uint)major; uVar20 = uVar20 + 1) {
            printf(" %s (v%u)\n",pVVar14,(ulong)pVVar14->specVersion);
            pVVar14 = (VkLayerProperties *)&pVVar14->implementationVersion;
          }
        }
        free(local_818);
      }
    }
    if ((int)local_7e0 != 0) {
      major = 0;
      puts("Vulkan instance layers:");
      VVar9 = (*glad_vkEnumerateInstanceLayerProperties)
                        ((uint32_t *)&major,(VkLayerProperties *)0x0);
      if (VVar9 == VK_SUCCESS) {
        local_818 = (VkLayerProperties *)calloc((ulong)(uint)major,0x208);
        VVar9 = (*glad_vkEnumerateInstanceLayerProperties)((uint32_t *)&major,local_818);
        if (VVar9 == VK_SUCCESS) {
          pcVar15 = local_818->description;
          for (uVar20 = 0; uVar20 < (uint)major; uVar20 = uVar20 + 1) {
            printf(" %s (v%u) \"%s\"\n",(VkLayerProperties *)(pcVar15 + -0x108),
                   (ulong)(*(uint *)(pcVar15 + -8) >> 0x16),pcVar15);
            pcVar15 = pcVar15 + 0x208;
          }
        }
        free(local_818);
      }
    }
    _accumbluebits = _accumbluebits & 0xffffffff00000000;
    local_7b8 = "glfwinfo";
    uStack_7b0._0_4_ = 0xc03004;
    uStack_7a0 = CONCAT44((uint)(0x400fff < uVar6) << 0xc,(uint32_t)uStack_7a0) | 0x40000000000000;
    _minor = CONCAT44(uStack_794,1);
    pVStack_780 = (VkApplicationInfo *)&accumbluebits;
    local_768._0_4_ = re_count;
    ppcStack_760 = ppcVar12;
    VVar9 = (*glad_vkCreateInstance)
                      ((VkInstanceCreateInfo *)&minor,(VkAllocationCallbacks *)0x0,
                       (VkInstance *)&accumalphabits);
    if (VVar9 == VK_SUCCESS) {
      gladLoadVulkanUserPtr
                ((VkPhysicalDevice)0x0,glad_vulkan_callback,
                 (void *)CONCAT44(uStack_80c,accumalphabits));
      VVar9 = (*glad_vkEnumeratePhysicalDevices)
                        ((VkInstance)CONCAT44(uStack_80c,accumalphabits),&pd_count,
                         (VkPhysicalDevice *)0x0);
      if (VVar9 == VK_SUCCESS) {
        __ptr = (VkPhysicalDevice *)calloc((ulong)pd_count,8);
        VVar9 = (*glad_vkEnumeratePhysicalDevices)
                          ((VkInstance)CONCAT44(uStack_80c,accumalphabits),&pd_count,__ptr);
        if (VVar9 == VK_SUCCESS) {
          for (uVar20 = 0; uVar20 < pd_count; uVar20 = uVar20 + 1) {
            (*glad_vkGetPhysicalDeviceProperties)
                      (__ptr[uVar20],(VkPhysicalDeviceProperties *)&major);
            pcVar15 = "unknown";
            if ((ulong)local_740 < 5) {
              pcVar15 = &DAT_0012f0d8 + *(int *)(&DAT_0012f0d8 + (ulong)local_740 * 4);
            }
            printf("Vulkan %s device: \"%s\" API version %i.%i\n",pcVar15,local_73c,
                   (ulong)((uint)major >> 0x16),(ulong)((uint)major >> 0xc & 0x3ff));
            if (iVar3 != 0) {
              pVVar1 = __ptr[uVar20];
              puts("Vulkan device extensions:");
              VVar9 = (*glad_vkEnumerateDeviceExtensionProperties)
                                (pVVar1,(char *)0x0,(uint32_t *)&auxbuffers,
                                 (VkExtensionProperties *)0x0);
              if (VVar9 == VK_SUCCESS) {
                __ptr_00 = (VkExtensionProperties *)calloc((ulong)(uint)auxbuffers,0x104);
                VVar9 = (*glad_vkEnumerateDeviceExtensionProperties)
                                  (pVVar1,(char *)0x0,(uint32_t *)&auxbuffers,__ptr_00);
                if (VVar9 == VK_SUCCESS) {
                  pVVar17 = __ptr_00;
                  for (uVar21 = 0; uVar21 < (uint)auxbuffers; uVar21 = uVar21 + 1) {
                    printf(" %s (v%u)\n",pVVar17,(ulong)pVVar17->specVersion);
                    pVVar17 = pVVar17 + 1;
                  }
                }
                free(__ptr_00);
              }
            }
            if ((int)local_7e0 != 0) {
              pVVar1 = __ptr[uVar20];
              puts("Vulkan device layers:");
              VVar9 = (*glad_vkEnumerateDeviceLayerProperties)
                                (pVVar1,(uint32_t *)&auxbuffers,(VkLayerProperties *)0x0);
              if (VVar9 == VK_SUCCESS) {
                pVVar14 = (VkLayerProperties *)calloc((ulong)(uint)auxbuffers,0x208);
                VVar9 = (*glad_vkEnumerateDeviceLayerProperties)
                                  (pVVar1,(uint32_t *)&auxbuffers,pVVar14);
                if (VVar9 == VK_SUCCESS) {
                  pcVar15 = pVVar14->description;
                  for (uVar21 = 0; uVar21 < (uint)auxbuffers; uVar21 = uVar21 + 1) {
                    printf(" %s (v%u) \"%s\"\n",(VkLayerProperties *)(pcVar15 + -0x108),
                           (ulong)(*(uint *)(pcVar15 + -8) >> 0x16),pcVar15);
                    pcVar15 = pcVar15 + 0x208;
                  }
                }
                free(pVVar14);
              }
            }
          }
          free(__ptr);
          (*glad_vkDestroyInstance)
                    ((VkInstance)CONCAT44(uStack_80c,accumalphabits),(VkAllocationCallbacks *)0x0);
          goto LAB_0011988a;
        }
        free(__ptr);
      }
      (*glad_vkDestroyInstance)
                ((VkInstance)CONCAT44(uStack_80c,accumalphabits),(VkAllocationCallbacks *)0x0);
    }
  }
  glfwTerminate();
LAB_00119180:
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, client, major, minor, revision, profile;
    GLint redbits, greenbits, bluebits, alphabits, depthbits, stencilbits;
    int list_extensions = GLFW_FALSE, list_layers = GLFW_FALSE;
    GLenum error;
    GLFWwindow* window;

    enum { CLIENT, CONTEXT, BEHAVIOR, DEBUG_CONTEXT, FORWARD, HELP,
           EXTENSIONS, LAYERS,
           MAJOR, MINOR, PROFILE, ROBUSTNESS, VERSION,
           REDBITS, GREENBITS, BLUEBITS, ALPHABITS, DEPTHBITS, STENCILBITS,
           ACCUMREDBITS, ACCUMGREENBITS, ACCUMBLUEBITS, ACCUMALPHABITS,
           AUXBUFFERS, SAMPLES, STEREO, SRGB, SINGLEBUFFER, NOERROR_SRSLY,
           GRAPHICS_SWITCHING };
    const struct option options[] =
    {
        { "behavior",           1, NULL, BEHAVIOR },
        { "client-api",         1, NULL, CLIENT },
        { "context-api",        1, NULL, CONTEXT },
        { "debug",              0, NULL, DEBUG_CONTEXT },
        { "forward",            0, NULL, FORWARD },
        { "help",               0, NULL, HELP },
        { "list-extensions",    0, NULL, EXTENSIONS },
        { "list-layers",        0, NULL, LAYERS },
        { "major",              1, NULL, MAJOR },
        { "minor",              1, NULL, MINOR },
        { "profile",            1, NULL, PROFILE },
        { "robustness",         1, NULL, ROBUSTNESS },
        { "version",            0, NULL, VERSION },
        { "red-bits",           1, NULL, REDBITS },
        { "green-bits",         1, NULL, GREENBITS },
        { "blue-bits",          1, NULL, BLUEBITS },
        { "alpha-bits",         1, NULL, ALPHABITS },
        { "depth-bits",         1, NULL, DEPTHBITS },
        { "stencil-bits",       1, NULL, STENCILBITS },
        { "accum-red-bits",     1, NULL, ACCUMREDBITS },
        { "accum-green-bits",   1, NULL, ACCUMGREENBITS },
        { "accum-blue-bits",    1, NULL, ACCUMBLUEBITS },
        { "accum-alpha-bits",   1, NULL, ACCUMALPHABITS },
        { "aux-buffers",        1, NULL, AUXBUFFERS },
        { "samples",            1, NULL, SAMPLES },
        { "stereo",             0, NULL, STEREO },
        { "srgb",               0, NULL, SRGB },
        { "singlebuffer",       0, NULL, SINGLEBUFFER },
        { "no-error",           0, NULL, NOERROR_SRSLY },
        { "graphics-switching", 0, NULL, GRAPHICS_SWITCHING },
        { NULL, 0, NULL, 0 }
    };

    // Initialize GLFW and create window

    if (!valid_version())
        exit(EXIT_FAILURE);

    glfwSetErrorCallback(error_callback);

    glfwInitHint(GLFW_COCOA_MENUBAR, GLFW_FALSE);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt_long(argc, argv, "a:b:c:dfhlm:n:p:s:v", options, NULL)) != -1)
    {
        switch (ch)
        {
            case 'a':
            case CLIENT:
                if (strcasecmp(optarg, API_NAME_OPENGL) == 0)
                    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_API);
                else if (strcasecmp(optarg, API_NAME_OPENGL_ES) == 0)
                    glfwWindowHint(GLFW_CLIENT_API, GLFW_OPENGL_ES_API);
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'b':
            case BEHAVIOR:
                if (strcasecmp(optarg, BEHAVIOR_NAME_NONE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR,
                                   GLFW_RELEASE_BEHAVIOR_NONE);
                }
                else if (strcasecmp(optarg, BEHAVIOR_NAME_FLUSH) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_RELEASE_BEHAVIOR,
                                   GLFW_RELEASE_BEHAVIOR_FLUSH);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'c':
            case CONTEXT:
                if (strcasecmp(optarg, API_NAME_NATIVE) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_NATIVE_CONTEXT_API);
                else if (strcasecmp(optarg, API_NAME_EGL) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_EGL_CONTEXT_API);
                else if (strcasecmp(optarg, API_NAME_OSMESA) == 0)
                    glfwWindowHint(GLFW_CONTEXT_CREATION_API, GLFW_OSMESA_CONTEXT_API);
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'd':
            case DEBUG_CONTEXT:
                glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE);
                break;
            case 'f':
            case FORWARD:
                glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GLFW_TRUE);
                break;
            case 'h':
            case HELP:
                usage();
                exit(EXIT_SUCCESS);
            case 'l':
            case EXTENSIONS:
                list_extensions = GLFW_TRUE;
                break;
            case LAYERS:
                list_layers = GLFW_TRUE;
                break;
            case 'm':
            case MAJOR:
                glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, atoi(optarg));
                break;
            case 'n':
            case MINOR:
                glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, atoi(optarg));
                break;
            case 'p':
            case PROFILE:
                if (strcasecmp(optarg, PROFILE_NAME_CORE) == 0)
                {
                    glfwWindowHint(GLFW_OPENGL_PROFILE,
                                   GLFW_OPENGL_CORE_PROFILE);
                }
                else if (strcasecmp(optarg, PROFILE_NAME_COMPAT) == 0)
                {
                    glfwWindowHint(GLFW_OPENGL_PROFILE,
                                   GLFW_OPENGL_COMPAT_PROFILE);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 's':
            case ROBUSTNESS:
                if (strcasecmp(optarg, STRATEGY_NAME_NONE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS,
                                   GLFW_NO_RESET_NOTIFICATION);
                }
                else if (strcasecmp(optarg, STRATEGY_NAME_LOSE) == 0)
                {
                    glfwWindowHint(GLFW_CONTEXT_ROBUSTNESS,
                                   GLFW_LOSE_CONTEXT_ON_RESET);
                }
                else
                {
                    usage();
                    exit(EXIT_FAILURE);
                }
                break;
            case 'v':
            case VERSION:
                print_version();
                exit(EXIT_SUCCESS);
            case REDBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_RED_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_RED_BITS, atoi(optarg));
                break;
            case GREENBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_GREEN_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_GREEN_BITS, atoi(optarg));
                break;
            case BLUEBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_BLUE_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_BLUE_BITS, atoi(optarg));
                break;
            case ALPHABITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ALPHA_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ALPHA_BITS, atoi(optarg));
                break;
            case DEPTHBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_DEPTH_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_DEPTH_BITS, atoi(optarg));
                break;
            case STENCILBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_STENCIL_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_STENCIL_BITS, atoi(optarg));
                break;
            case ACCUMREDBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_RED_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_RED_BITS, atoi(optarg));
                break;
            case ACCUMGREENBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_GREEN_BITS, atoi(optarg));
                break;
            case ACCUMBLUEBITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_BLUE_BITS, atoi(optarg));
                break;
            case ACCUMALPHABITS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_ACCUM_ALPHA_BITS, atoi(optarg));
                break;
            case AUXBUFFERS:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_AUX_BUFFERS, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_AUX_BUFFERS, atoi(optarg));
                break;
            case SAMPLES:
                if (strcmp(optarg, "-") == 0)
                    glfwWindowHint(GLFW_SAMPLES, GLFW_DONT_CARE);
                else
                    glfwWindowHint(GLFW_SAMPLES, atoi(optarg));
                break;
            case STEREO:
                glfwWindowHint(GLFW_STEREO, GLFW_TRUE);
                break;
            case SRGB:
                glfwWindowHint(GLFW_SRGB_CAPABLE, GLFW_TRUE);
                break;
            case SINGLEBUFFER:
                glfwWindowHint(GLFW_DOUBLEBUFFER, GLFW_FALSE);
                break;
            case NOERROR_SRSLY:
                glfwWindowHint(GLFW_CONTEXT_NO_ERROR, GLFW_TRUE);
                break;
            case GRAPHICS_SWITCHING:
                glfwWindowHint(GLFW_COCOA_GRAPHICS_SWITCHING, GLFW_TRUE);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    print_version();

    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    window = glfwCreateWindow(200, 200, "Version", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    error = glGetError();
    if (error != GL_NO_ERROR)
        printf("*** OpenGL error after make current: 0x%08x ***\n", error);

    // Report client API version

    client = glfwGetWindowAttrib(window, GLFW_CLIENT_API);
    major = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MAJOR);
    minor = glfwGetWindowAttrib(window, GLFW_CONTEXT_VERSION_MINOR);
    revision = glfwGetWindowAttrib(window, GLFW_CONTEXT_REVISION);
    profile = glfwGetWindowAttrib(window, GLFW_OPENGL_PROFILE);

    printf("%s context version string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_VERSION));

    printf("%s context version parsed by GLFW: %u.%u.%u\n",
           get_api_name(client),
           major, minor, revision);

    // Report client API context properties

    if (client == GLFW_OPENGL_API)
    {
        if (major >= 3)
        {
            GLint flags;

            glGetIntegerv(GL_CONTEXT_FLAGS, &flags);
            printf("%s context flags (0x%08x):", get_api_name(client), flags);

            if (flags & GL_CONTEXT_FLAG_FORWARD_COMPATIBLE_BIT)
                printf(" forward-compatible");
            if (flags & 2/*GL_CONTEXT_FLAG_DEBUG_BIT*/)
                printf(" debug");
            if (flags & GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT_ARB)
                printf(" robustness");
            if (flags & 8/*GL_CONTEXT_FLAG_NO_ERROR_BIT_KHR*/)
                printf(" no-error");
            putchar('\n');

            printf("%s context flags parsed by GLFW:", get_api_name(client));

            if (glfwGetWindowAttrib(window, GLFW_OPENGL_FORWARD_COMPAT))
                printf(" forward-compatible");
            if (glfwGetWindowAttrib(window, GLFW_OPENGL_DEBUG_CONTEXT))
                printf(" debug");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS) == GLFW_LOSE_CONTEXT_ON_RESET)
                printf(" robustness");
            if (glfwGetWindowAttrib(window, GLFW_CONTEXT_NO_ERROR))
                printf(" no-error");
            putchar('\n');
        }

        if (major >= 4 || (major == 3 && minor >= 2))
        {
            GLint mask;
            glGetIntegerv(GL_CONTEXT_PROFILE_MASK, &mask);

            printf("%s profile mask (0x%08x): %s\n",
                   get_api_name(client),
                   mask,
                   get_profile_name_gl(mask));

            printf("%s profile mask parsed by GLFW: %s\n",
                   get_api_name(client),
                   get_profile_name_glfw(profile));
        }

        if (GLAD_GL_ARB_robustness)
        {
            const int robustness = glfwGetWindowAttrib(window, GLFW_CONTEXT_ROBUSTNESS);
            GLint strategy;
            glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY_ARB, &strategy);

            printf("%s robustness strategy (0x%08x): %s\n",
                   get_api_name(client),
                   strategy,
                   get_strategy_name_gl(strategy));

            printf("%s robustness strategy parsed by GLFW: %s\n",
                   get_api_name(client),
                   get_strategy_name_glfw(robustness));
        }
    }

    printf("%s context renderer string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_RENDERER));
    printf("%s context vendor string: \"%s\"\n",
           get_api_name(client),
           glGetString(GL_VENDOR));

    if (major >= 2)
    {
        printf("%s context shading language version: \"%s\"\n",
               get_api_name(client),
               glGetString(GL_SHADING_LANGUAGE_VERSION));
    }

    printf("%s framebuffer:\n", get_api_name(client));

    if (client == GLFW_OPENGL_API && profile == GLFW_OPENGL_CORE_PROFILE)
    {
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE,
                                              &redbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE,
                                              &greenbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE,
                                              &bluebits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_BACK_LEFT,
                                              GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE,
                                              &alphabits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_DEPTH,
                                              GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE,
                                              &depthbits);
        glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER,
                                              GL_STENCIL,
                                              GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE,
                                              &stencilbits);
    }
    else
    {
        glGetIntegerv(GL_RED_BITS, &redbits);
        glGetIntegerv(GL_GREEN_BITS, &greenbits);
        glGetIntegerv(GL_BLUE_BITS, &bluebits);
        glGetIntegerv(GL_ALPHA_BITS, &alphabits);
        glGetIntegerv(GL_DEPTH_BITS, &depthbits);
        glGetIntegerv(GL_STENCIL_BITS, &stencilbits);
    }

    printf(" red: %u green: %u blue: %u alpha: %u depth: %u stencil: %u\n",
           redbits, greenbits, bluebits, alphabits, depthbits, stencilbits);

    if (client == GLFW_OPENGL_ES_API ||
        GLAD_GL_ARB_multisample ||
        major > 1 || minor >= 3)
    {
        GLint samples, samplebuffers;
        glGetIntegerv(GL_SAMPLES, &samples);
        glGetIntegerv(GL_SAMPLE_BUFFERS, &samplebuffers);

        printf(" samples: %u sample buffers: %u\n", samples, samplebuffers);
    }

    if (client == GLFW_OPENGL_API && profile != GLFW_OPENGL_CORE_PROFILE)
    {
        GLint accumredbits, accumgreenbits, accumbluebits, accumalphabits;
        GLint auxbuffers;

        glGetIntegerv(GL_ACCUM_RED_BITS, &accumredbits);
        glGetIntegerv(GL_ACCUM_GREEN_BITS, &accumgreenbits);
        glGetIntegerv(GL_ACCUM_BLUE_BITS, &accumbluebits);
        glGetIntegerv(GL_ACCUM_ALPHA_BITS, &accumalphabits);
        glGetIntegerv(GL_AUX_BUFFERS, &auxbuffers);

        printf(" accum red: %u accum green: %u accum blue: %u accum alpha: %u aux buffers: %u\n",
               accumredbits, accumgreenbits, accumbluebits, accumalphabits, auxbuffers);
    }

    if (list_extensions)
        list_context_extensions(client, major, minor);

    printf("Vulkan loader: %s\n",
           glfwVulkanSupported() ? "available" : "missing");

    if (glfwVulkanSupported())
    {
        uint32_t loader_version = VK_API_VERSION_1_0;
        uint32_t i, re_count, pd_count;
        const char** re;
        VkApplicationInfo ai = {0};
        VkInstanceCreateInfo ici = {0};
        VkInstance instance;
        VkPhysicalDevice* pd;

        gladLoadVulkanUserPtr(NULL, glad_vulkan_callback, NULL);

        if (vkEnumerateInstanceVersion)
        {
            uint32_t version;
            if (vkEnumerateInstanceVersion(&version) == VK_SUCCESS)
                loader_version = version;
        }

        printf("Vulkan loader API version: %i.%i\n",
               VK_VERSION_MAJOR(loader_version),
               VK_VERSION_MINOR(loader_version));

        re = glfwGetRequiredInstanceExtensions(&re_count);

        printf("Vulkan required instance extensions:");
        if (re)
        {
            for (i = 0;  i < re_count;  i++)
                printf(" %s", re[i]);
            putchar('\n');
        }
        else
            printf(" missing\n");

        if (list_extensions)
            list_vulkan_instance_extensions();

        if (list_layers)
            list_vulkan_instance_layers();

        ai.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        ai.pApplicationName = "glfwinfo";
        ai.applicationVersion = VK_MAKE_VERSION(GLFW_VERSION_MAJOR,
                                                GLFW_VERSION_MINOR,
                                                GLFW_VERSION_REVISION);

        if (loader_version >= VK_API_VERSION_1_1)
            ai.apiVersion = VK_API_VERSION_1_1;
        else
            ai.apiVersion = VK_API_VERSION_1_0;

        ici.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
        ici.pApplicationInfo = &ai;
        ici.enabledExtensionCount = re_count;
        ici.ppEnabledExtensionNames = re;

        if (vkCreateInstance(&ici, NULL, &instance) != VK_SUCCESS)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        gladLoadVulkanUserPtr(NULL, glad_vulkan_callback, instance);

        if (vkEnumeratePhysicalDevices(instance, &pd_count, NULL) != VK_SUCCESS)
        {
            vkDestroyInstance(instance, NULL);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        pd = calloc(pd_count, sizeof(VkPhysicalDevice));

        if (vkEnumeratePhysicalDevices(instance, &pd_count, pd) != VK_SUCCESS)
        {
            free(pd);
            vkDestroyInstance(instance, NULL);
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        for (i = 0;  i < pd_count;  i++)
        {
            VkPhysicalDeviceProperties pdp;

            vkGetPhysicalDeviceProperties(pd[i], &pdp);

            printf("Vulkan %s device: \"%s\" API version %i.%i\n",
                   get_device_type_name(pdp.deviceType),
                   pdp.deviceName,
                   VK_VERSION_MAJOR(pdp.apiVersion),
                   VK_VERSION_MINOR(pdp.apiVersion));

            if (list_extensions)
                list_vulkan_device_extensions(instance, pd[i]);

            if (list_layers)
                list_vulkan_device_layers(instance, pd[i]);
        }

        free(pd);
        vkDestroyInstance(instance, NULL);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}